

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFromDarSeqSweep(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  void *pvVar1;
  void *pvVar2;
  Nm_Man_t *pNVar3;
  Abc_Obj_t *pObj;
  bool bVar4;
  uint uVar5;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  long lVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  Abc_Ntk_t *pAVar17;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1dc,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  if (pNtkOld->nBarBufs != 0) {
    __assert_fail("pNtkOld->nBarBufs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1dd,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  pNtk = Abc_NtkStartFromNoLatches(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pMan->nBarBufs;
  iVar14 = pNtk->vCis->nSize;
  if (iVar14 < pMan->nObjs[2] - pMan->nRegs) {
    iVar14 = pMan->nObjs[2] - (iVar14 + pMan->nRegs);
    if (0 < iVar14) {
      iVar14 = iVar14 + 1;
      do {
        pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
        pcVar7 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar6,pcVar7,(char *)0x0);
        iVar14 = iVar14 + -1;
      } while (1 < iVar14);
    }
    Abc_NtkOrderCisCos(pNtk);
  }
  if (pNtk->vCis->nSize != pMan->nObjs[2] - pMan->nRegs) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1ed,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  if (pNtk->vCos->nSize != pMan->nObjs[3] - pMan->nRegs) {
    __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x1ee,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
  }
  pAVar6 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar6;
  if (pMan->nRegs < pMan->nObjs[2]) {
    lVar8 = 0;
    do {
      if ((pMan->vCis->nSize <= lVar8) || (pNtk->vCis->nSize <= lVar8)) goto LAB_002a6039;
      *(void **)((long)pMan->vCis->pArray[lVar8] + 0x28) = pNtk->vCis->pArray[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 < (long)pMan->nObjs[2] - (long)pMan->nRegs);
  }
  iVar14 = pMan->nRegs;
  if (0 < iVar14) {
    iVar15 = 0;
    do {
      uVar12 = (pMan->nObjs[3] - iVar14) + iVar15;
      if (((((int)uVar12 < 0) || (pMan->vCos->nSize <= (int)uVar12)) ||
          (uVar16 = (pMan->nObjs[2] - iVar14) + iVar15, (int)uVar16 < 0)) ||
         (pMan->vCis->nSize <= (int)uVar16)) goto LAB_002a6039;
      pvVar1 = pMan->vCos->pArray[uVar12];
      pvVar2 = pMan->vCis->pArray[uVar16];
      pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
      pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar9;
      pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar9;
      Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)((long)pvVar1 + 0x28));
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar2 + 0x28),pAVar6);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                      ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
      pAVar6->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      iVar15 = iVar15 + 1;
      iVar14 = pMan->nRegs;
    } while (iVar15 < iVar14);
  }
  pVVar10 = Aig_ManDfs(pMan,1);
  if (0 < pVVar10->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar10->pArray[lVar8];
      if ((*(uint *)((long)pvVar1 + 0x18) & 7) == 4) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002a6058;
        uVar13 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar6 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
      }
      else {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002a6058;
        uVar13 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar6 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        uVar13 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar9 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar6,pAVar9);
      }
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar10->nSize);
  }
  if (pVVar10->pArray != (void **)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (void **)0x0;
  }
  if (pVVar10 != (Vec_Ptr_t *)0x0) {
    free(pVVar10);
  }
  pVVar10 = pMan->vCos;
  if (0 < pVVar10->nSize) {
    lVar8 = 0;
    do {
      if (pNtk->vCos->nSize <= lVar8) goto LAB_002a6039;
      pvVar1 = pVVar10->pArray[lVar8];
      pNVar3 = pNtk->pManName;
      pcVar7 = Abc_ObjName((Abc_Obj_t *)pNtk->vCos->pArray[lVar8]);
      uVar12 = Nm_ManFindIdByNameTwoTypes(pNVar3,pcVar7,2,5);
      if ((int)uVar12 < 0) {
        if (((ulong)pvVar1 & 1) != 0) {
LAB_002a6058:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar13 = *(ulong *)((long)pvVar1 + 8);
        uVar11 = uVar13 & 0xfffffffffffffffe;
        if (uVar11 == 0) {
          pAVar6 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Abc_Obj_t *)((ulong)((uint)uVar13 & 1) ^ *(ulong *)(uVar11 + 0x28));
        }
      }
      else {
        if (pNtk->vObjs->nSize <= (int)uVar12) goto LAB_002a6039;
        pAVar6 = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar12];
      }
      if (pNtk->vCos->nSize <= lVar8) goto LAB_002a6039;
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vCos->pArray[lVar8],pAVar6);
      lVar8 = lVar8 + 1;
      pVVar10 = pMan->vCos;
    } while (lVar8 < pVVar10->nSize);
  }
  if (pMan->vFlopNums == (Vec_Int_t *)0x0) {
    Abc_NtkAddDummyBoxNames(pNtk);
  }
  else {
    if (pNtkOld->vBoxes->nSize != pNtkOld->nObjCounts[8]) {
      __assert_fail("Abc_NtkBoxNum(pNtkOld) == Abc_NtkLatchNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                    ,0x22a,"Abc_Ntk_t *Abc_NtkFromDarSeqSweep(Abc_Ntk_t *, Aig_Man_t *)");
    }
    uVar12 = pNtk->nObjCounts[8];
    if (1 < uVar12) {
      uVar16 = 0;
      uVar5 = uVar12 - 1;
      uVar12 = uVar16;
      if (uVar5 != 0) {
        do {
          uVar12 = uVar16 + 1;
          bVar4 = 9 < uVar5;
          uVar16 = uVar12;
          uVar5 = uVar5 / 10;
        } while (bVar4);
      }
    }
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar8 = 0;
      do {
        pAVar6 = (Abc_Obj_t *)pVVar10->pArray[lVar8];
        if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
          if (pMan->vFlopNums->nSize <= lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar14 = pMan->vFlopNums->pArray[lVar8];
          if (((long)iVar14 < 0) || (pNtkOld->vBoxes->nSize <= iVar14)) {
LAB_002a6039:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar9 = (Abc_Obj_t *)pNtkOld->vBoxes->pArray[iVar14];
          pNVar3 = pNtk->pManName;
          pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanouts).pArray])
          ;
          iVar14 = Nm_ManFindIdByName(pNVar3,pcVar7,3);
          if (iVar14 < 0) {
            pcVar7 = Abc_ObjName(pAVar9);
            Abc_ObjAssignName(pAVar6,pcVar7,(char *)0x0);
            pObj = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
            pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray]
                                );
            Abc_ObjAssignName(pObj,pcVar7,(char *)0x0);
            pAVar6 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray];
            pcVar7 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanouts).pArray]);
          }
          else {
            iVar14 = (int)lVar8;
            pcVar7 = Abc_ObjNameDummy("l",iVar14,uVar12);
            Abc_ObjAssignName(pAVar6,pcVar7,(char *)0x0);
            pAVar9 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
            pcVar7 = Abc_ObjNameDummy("li",iVar14,uVar12);
            Abc_ObjAssignName(pAVar9,pcVar7,(char *)0x0);
            pAVar6 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray];
            pcVar7 = Abc_ObjNameDummy("lo",iVar14,uVar12);
          }
          Abc_ObjAssignName(pAVar6,pcVar7,(char *)0x0);
        }
        lVar8 = lVar8 + 1;
        pVVar10 = pNtk->vBoxes;
      } while (lVar8 < pVVar10->nSize);
    }
  }
  pAVar17 = pNtk;
  iVar14 = Abc_NtkCheck(pNtk);
  if (iVar14 == 0) {
    Abc_Print((int)pAVar17,"Abc_NtkFromDar(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDarSeqSweep( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pLatch;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i, iNodeId, nDigits; 
    assert( pMan->nAsserts == 0 );
    assert( pNtkOld->nBarBufs == 0 );
//    assert( Aig_ManRegNum(pMan) != Abc_NtkLatchNum(pNtkOld) );
    // perform strashing
    pNtkNew = Abc_NtkStartFromNoLatches( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // consider the case of target enlargement
    if ( Abc_NtkCiNum(pNtkNew) < Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) )
    {
        for ( i = Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) - Abc_NtkCiNum(pNtkNew); i > 0; i-- )
        {
            pObjNew = Abc_NtkCreatePi( pNtkNew );
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        }
        Abc_NtkOrderCisCos( pNtkNew );
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // transfer the pointers to the basic nodes
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachPiSeq( pMan, pObj, i )
        pObj->pData = Abc_NtkCi(pNtkNew, i);
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
//        if ( pMan->nAsserts && i == Aig_ManCoNum(pMan) - pMan->nAsserts )
//            break;
        iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(Abc_NtkCo(pNtkNew, i)), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( iNodeId >= 0 )
            pObjNew = Abc_NtkObj( pNtkNew, iNodeId );
        else
            pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }
    if ( pMan->vFlopNums == NULL )
        Abc_NtkAddDummyBoxNames( pNtkNew );
    else
    {
/*
        {
            int i, k, iFlop, Counter = 0;
            FILE * pFile;
            pFile = fopen( "out.txt", "w" );
            fAbc_Print( 1, pFile, "The total of %d registers were removed (out of %d):\n", 
                Abc_NtkLatchNum(pNtkOld)-Vec_IntSize(pMan->vFlopNums), Abc_NtkLatchNum(pNtkOld) );
            for ( i = 0; i < Abc_NtkLatchNum(pNtkOld); i++ )
            {
                Vec_IntForEachEntry( pMan->vFlopNums, iFlop, k )
                {
                    if ( i == iFlop )
                        break;
                }
                if ( k == Vec_IntSize(pMan->vFlopNums) )
                    fAbc_Print( 1, pFile, "%6d (%6d)  :  %s\n", ++Counter, i, Abc_ObjName( Abc_ObjFanout0(Abc_NtkBox(pNtkOld, i)) ) );
            }
            fclose( pFile );
            //Abc_Print( 1, "\n" );
        }
*/
        assert( Abc_NtkBoxNum(pNtkOld) == Abc_NtkLatchNum(pNtkOld) );
        nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtkNew) );
        Abc_NtkForEachLatch( pNtkNew, pObjNew, i )
        {
            pLatch = Abc_NtkBox( pNtkOld, Vec_IntEntry( pMan->vFlopNums, i ) );
            iNodeId = Nm_ManFindIdByName( pNtkNew->pManName, Abc_ObjName(Abc_ObjFanout0(pLatch)), ABC_OBJ_PO );
            if ( iNodeId >= 0 )
            {
                Abc_ObjAssignName( pObjNew, Abc_ObjNameDummy("l", i, nDigits), NULL );
                Abc_ObjAssignName( Abc_ObjFanin0(pObjNew), Abc_ObjNameDummy("li", i, nDigits), NULL );
                Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjNameDummy("lo", i, nDigits), NULL );
//Abc_Print( 1, "happening   %s -> %s\n", Abc_ObjName(Abc_ObjFanin0(pObjNew)), Abc_ObjName(Abc_ObjFanout0(pObjNew)) );
                continue;
            }
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pLatch), NULL );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pLatch)), NULL );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pLatch)), NULL );
        }
    }
    // if there are assertions, add them
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );
    return pNtkNew;
}